

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  byte *pbVar1;
  size_t sVar2;
  long lVar3;
  uv__io_cb p_Var4;
  long *plVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  uint *puVar9;
  cmsghdr *pcVar10;
  uint uVar11;
  uv__io_t *puVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  undefined8 uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uv_stream_t *stream;
  msghdr msg;
  int error;
  uv_buf_t local_1d0;
  uint local_1bc;
  cmsghdr *local_1b8;
  int local_1ac;
  uv_stream_t *local_1a8;
  ulong local_1a0;
  size_t local_198;
  ulong local_190;
  uint *local_188;
  msghdr local_180;
  cmsghdr local_148 [17];
  
  uVar15 = w[-3].fd;
  if ((0xe < uVar15) || ((0x5080U >> (uVar15 & 0x1f) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x505,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((*(uint *)w[-1].pending_queue & 1) != 0) {
    __assert_fail("!(stream->flags & UV_CLOSING)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x506,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  stream = (uv_stream_t *)(w[-3].watcher_queue + 1);
  lVar7 = *(long *)&w[-1].pevents;
  if (lVar7 != 0) {
    local_180.msg_name = (void *)CONCAT44(local_180.msg_name._4_4_,4);
    if ((uVar15 != 7) && (uVar15 != 0xc)) {
      __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x53c,"void uv__stream_connect(uv_stream_t *)");
    }
    uVar15 = w[1].pevents;
    if (uVar15 == 0) {
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x548,"void uv__stream_connect(uv_stream_t *)");
      }
      getsockopt(w->fd,1,4,local_148,(socklen_t *)&local_180);
      uVar15 = -(uint)local_148[0].cmsg_len;
      local_148[0].cmsg_len = CONCAT44(local_148[0].cmsg_len._4_4_,uVar15);
    }
    else {
      local_148[0].cmsg_len = CONCAT44(local_148[0].cmsg_len._4_4_,uVar15);
      w[1].pevents = 0;
    }
    if (uVar15 == 0xffffff8d) {
      return;
    }
    w[-1].pevents = 0;
    w[-1].events = 0;
    if (*(long *)&w[-3].pevents + 0x20 == *(long *)(*(long *)&w[-3].pevents + 0x20)) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x555,"void uv__stream_connect(uv_stream_t *)");
    }
    lVar3 = *(long *)(lVar7 + 0x10);
    **(long **)(lVar7 + 0x18) = lVar3;
    *(undefined8 *)(lVar3 + 8) = *(undefined8 *)(lVar7 + 0x18);
    if (((int)uVar15 < 0) || (w + 1 == (uv__io_t *)w[1].cb)) {
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
      uVar15 = (uint)local_148[0].cmsg_len;
    }
    if (*(code **)(lVar7 + 0x40) != (code *)0x0) {
      (**(code **)(lVar7 + 0x40))(lVar7);
      uVar15 = (uint)local_148[0].cmsg_len;
    }
    if (w->fd == -1) {
      return;
    }
    if (-1 < (int)uVar15) {
      return;
    }
    puVar12 = (uv__io_t *)w[1].cb;
    if (w + 1 != puVar12) {
      do {
        p_Var4 = puVar12->cb;
        *(uv__io_cb *)puVar12->pending_queue[0] = p_Var4;
        *(void **)(p_Var4 + 8) = puVar12->pending_queue[0];
        *(undefined4 *)((long)puVar12->watcher_queue + 0xc) = 0xffffff83;
        puVar12->cb = (uv__io_cb)(w[1].pending_queue + 1);
        plVar5 = (long *)w[1].watcher_queue[0];
        puVar12->pending_queue[0] = plVar5;
        *plVar5 = (long)puVar12;
        w[1].watcher_queue[0] = puVar12;
        puVar12 = (uv__io_t *)w[1].cb;
      } while (w + 1 != puVar12);
    }
    uv__write_callbacks(stream);
    return;
  }
  iVar6 = w->fd;
  if (iVar6 < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x50d,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((events & 0x19) != 0) {
    *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xfffffefe;
    uVar19 = 0;
    if (uVar15 == 7) {
      uVar19 = (ulong)(*(int *)&w[2].cb != 0);
    }
    local_188 = &w[1].events;
    uVar20 = uVar19;
    iVar6 = 0x20;
    local_1a8 = stream;
    do {
      if (((w[-1].watcher_queue[1] == (void *)0x0) || (((ulong)w[-1].pending_queue[0] & 4) == 0)) ||
         (iVar6 == 0)) goto LAB_0054a10c;
      if (w[-1].watcher_queue[0] == (void *)0x0) {
        __assert_fail("stream->alloc_cb != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x46c,"void uv__read(uv_stream_t *)");
      }
      local_1d0 = uv_buf_init((char *)0x0,0);
      (*(code *)w[-1].watcher_queue[0])(stream,0x10000,&local_1d0);
      if ((local_1d0.base == (char *)0x0) || (local_1d0.len == 0)) {
        uVar17 = 0xffffffffffffff97;
        goto LAB_0054a067;
      }
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x477,"void uv__read(uv_stream_t *)");
      }
      local_1ac = iVar6 + -1;
      if ((char)uVar20 == '\0') {
        while( true ) {
          lVar7 = read(w->fd,local_1d0.base,local_1d0.len);
          if (-1 < lVar7) break;
          piVar8 = __errno_location();
          iVar6 = *piVar8;
          if (iVar6 != 4) goto LAB_0054a041;
        }
      }
      else {
        local_180.msg_flags = 0;
        local_180.msg_iov = (iovec *)&local_1d0;
        local_180.msg_iovlen = 1;
        local_180.msg_name = (void *)0x0;
        local_180.msg_namelen = 0;
        local_180.msg_controllen = 0x110;
        local_180.msg_control = local_148;
        while (lVar7 = uv__recvmsg(w->fd,&local_180,0), lVar7 < 0) {
          piVar8 = __errno_location();
          iVar6 = *piVar8;
          if (iVar6 != 4) goto LAB_0054a041;
        }
      }
      if (lVar7 == 0) {
        uv__stream_eof(stream,&local_1d0);
        goto LAB_0054a10c;
      }
      local_198 = local_1d0.len;
      pcVar10 = (cmsghdr *)local_180.msg_control;
      local_1bc = events;
      local_190 = uVar20;
      if ((cmsghdr *)local_180.msg_control != (cmsghdr *)0x0 &&
          (0xf < local_180.msg_controllen && (char)uVar19 == '\x01')) {
        do {
          local_1b8 = pcVar10;
          if (pcVar10->cmsg_type == 1) {
            uVar20 = 0xffffffff;
            uVar15 = 0;
            do {
              uVar13 = uVar15;
              uVar18 = (int)uVar20 + 1;
              uVar20 = (ulong)uVar18;
              sVar2 = uVar20 * 4 + 0x10;
              uVar15 = uVar13 + 1;
            } while ((long)sVar2 < (long)pcVar10->cmsg_len);
            if (sVar2 != pcVar10->cmsg_len) {
              __assert_fail("start + CMSG_LEN(count * sizeof(*pi)) == end",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                            ,0x439,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
            }
            if (uVar18 != 0) {
              uVar16 = (ulong)uVar13;
              uVar14 = 0;
              local_1a0 = uVar16;
LAB_00549e5d:
              uVar15 = *(uint *)((long)&pcVar10[1].cmsg_len + uVar14 * 4);
              puVar9 = local_188;
              if (*local_188 == 0xffffffff) goto LAB_00549ee7;
              puVar9 = *(uint **)&w[1].fd;
              if (puVar9 != (uint *)0x0) {
                uVar13 = *puVar9;
                uVar11 = puVar9[1];
                if (uVar13 == uVar11) {
                  puVar9 = (uint *)uv__realloc(puVar9,(ulong)(uVar13 + 7) * 4 + 0xc);
                  if (puVar9 == (uint *)0x0) goto LAB_0054a0d5;
                  *puVar9 = uVar13 + 8;
                  *(uint **)&w[1].fd = puVar9;
                  uVar11 = puVar9[1];
                  uVar16 = local_1a0;
                  pcVar10 = local_1b8;
                }
LAB_00549ed7:
                puVar9[1] = uVar11 + 1;
                puVar9 = puVar9 + (ulong)uVar11 + 2;
                goto LAB_00549ee7;
              }
              puVar9 = (uint *)uv__malloc(0x28);
              if (puVar9 != (uint *)0x0) {
                puVar9[0] = 8;
                puVar9[1] = 0;
                *(uint **)&w[1].fd = puVar9;
                uVar11 = 0;
                uVar16 = local_1a0;
                pcVar10 = local_1b8;
                goto LAB_00549ed7;
              }
LAB_0054a0d5:
              pcVar10 = local_1b8;
              if ((uint)uVar14 < uVar18) {
                do {
                  uv__close(*(int *)((long)&pcVar10[1].cmsg_len + uVar14 * 4));
                  uVar14 = uVar14 + 1;
                } while (uVar14 < uVar20);
              }
              stream = local_1a8;
              (*(code *)w[-1].watcher_queue[1])(local_1a8,0xfffffffffffffff4,&local_1d0);
              events = local_1bc;
              goto LAB_0054a10c;
            }
          }
          else {
            fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n");
            pcVar10 = local_1b8;
          }
LAB_00549ef6:
          pcVar10 = __cmsg_nxthdr((msghdr *)&local_180,pcVar10);
          stream = local_1a8;
        } while (pcVar10 != (cmsghdr *)0x0);
      }
      (*(code *)w[-1].watcher_queue[1])(stream,lVar7,&local_1d0);
      uVar20 = local_190;
      iVar6 = local_1ac;
      events = local_1bc;
    } while ((long)local_198 <= lVar7);
    pbVar1 = (byte *)((long)w[-1].pending_queue + 1);
    *pbVar1 = *pbVar1 | 1;
    goto LAB_0054a10c;
  }
  goto LAB_0054a118;
LAB_00549ee7:
  *puVar9 = uVar15;
  uVar14 = uVar14 + 1;
  if (uVar16 == uVar14) goto LAB_00549ef6;
  goto LAB_00549e5d;
LAB_0054a041:
  if (iVar6 == 0xb) {
    if (((ulong)w[-1].pending_queue[0] & 4) != 0) {
      uv__io_start(*(uv_loop_t **)&w[-3].pevents,w,1);
    }
    uVar17 = 0;
LAB_0054a067:
    (*(code *)w[-1].watcher_queue[1])(stream,uVar17,&local_1d0);
  }
  else {
    (*(code *)w[-1].watcher_queue[1])(stream,(long)-iVar6,&local_1d0);
    if ((*(uint *)w[-1].pending_queue & 4) != 0) {
      *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xfffffffb;
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,1);
      iVar6 = uv__io_active(w,4);
      if (((iVar6 == 0) && (uVar15 = *(uint *)w[-1].pending_queue, (uVar15 >> 0xe & 1) != 0)) &&
         (*(uint *)w[-1].pending_queue = uVar15 & 0xffffbfff, (uVar15 >> 0xd & 1) != 0)) {
        piVar8 = (int *)(*(long *)&w[-3].pevents + 8);
        *piVar8 = *piVar8 + -1;
      }
    }
  }
LAB_0054a10c:
  iVar6 = w->fd;
  if (iVar6 == -1) {
    return;
  }
LAB_0054a118:
  if (((events & 0x10) != 0) && (((ulong)w[-1].pending_queue[0] & 0x304) == 0x104)) {
    local_148[0].cmsg_len = 0;
    local_148[0].cmsg_level = 0;
    local_148[0].cmsg_type = 0;
    uv__stream_eof(stream,(uv_buf_t *)local_148);
    iVar6 = w->fd;
  }
  if ((events & 0x1c) == 0) {
    return;
  }
  if (iVar6 == -1) {
    return;
  }
  uv__write(stream);
  uv__write_callbacks(stream);
  if (w + 1 != (uv__io_t *)w[1].cb) {
    return;
  }
  uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
  if ((*(uint *)w[-1].pending_queue & 0x19) != 8) {
    return;
  }
  lVar7 = *(long *)&w[-1].fd;
  if (lVar7 == 0) {
    __assert_fail("stream->shutdown_req",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x2a2,"void uv__drain(uv_stream_t *)");
  }
  *(undefined8 *)&w[-1].fd = 0;
  *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xffffffe6;
  if (*(long *)&w[-3].pevents + 0x20 == *(long *)(*(long *)&w[-3].pevents + 0x20)) {
    __assert_fail("uv__has_active_reqs(stream->loop)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x2a7,"void uv__drain(uv_stream_t *)");
  }
  lVar3 = *(long *)(lVar7 + 0x10);
  **(long **)(lVar7 + 0x18) = lVar3;
  *(undefined8 *)(lVar3 + 8) = *(undefined8 *)(lVar7 + 0x18);
  iVar6 = shutdown(w->fd,1);
  if (iVar6 != 0) {
    piVar8 = __errno_location();
    if (*piVar8 != 0) {
      iVar6 = -*piVar8;
      goto LAB_0054a1fb;
    }
  }
  *(byte *)w[-1].pending_queue = *(byte *)w[-1].pending_queue | 0x10;
  iVar6 = 0;
LAB_0054a1fb:
  if (*(code **)(lVar7 + 0x48) != (code *)0x0) {
    (**(code **)(lVar7 + 0x48))(lVar7,iVar6);
  }
  return;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even it it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_STREAM_READING) &&
      (stream->flags & UV_STREAM_READ_PARTIAL) &&
      !(stream->flags & UV_STREAM_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (QUEUE_EMPTY(&stream->write_queue))
      uv__drain(stream);
  }
}